

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O3

void bandit::use_default_reporters(choice_options *choices)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  option_map *this;
  string local_f8;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"singleline","");
  this = &choices->reporters;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:64:41)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:64:41)>
             ::_M_manager;
  detail::option_map::add(this,&local_f8,(controller_func_t *)&local_38,false);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"xunit","");
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:67:36)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:67:36)>
             ::_M_manager;
  detail::option_map::add(this,&local_f8,(controller_func_t *)&local_58,false);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"info","");
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:70:35)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:70:35)>
             ::_M_manager;
  detail::option_map::add(this,&local_f8,(controller_func_t *)&local_78,false);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"spec","");
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:73:35)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:73:35)>
             ::_M_manager;
  detail::option_map::add(this,&local_f8,(controller_func_t *)&local_98,false);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"crash","");
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:76:36)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:76:36)>
             ::_M_manager;
  detail::option_map::add(this,&local_f8,(controller_func_t *)&local_b8,false);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"dots","");
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:79:35)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:79:35)>
             ::_M_manager;
  detail::option_map::add(this,&local_f8,(controller_func_t *)&local_d8,true);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void use_default_reporters(detail::choice_options& choices) {
    choices.reporters.add("singleline", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::singleline(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("xunit", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::xunit(controller.get_formatter()));
    });
    choices.reporters.add("info", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::info(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("spec", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::spec(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("crash", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::crash(controller.get_formatter()));
    });
    choices.reporters.add("dots", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::dots(controller.get_formatter(), controller.get_colorizer()));
    }, true);
  }